

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8d4a5::ir_constant_propagation_visitor::handle_rvalue
          (ir_constant_propagation_visitor *this,ir_rvalue **rvalue)

{
  byte bVar1;
  uint uVar2;
  ir_node_type iVar3;
  uint uVar4;
  glsl_type *type;
  ir_rvalue *piVar5;
  exec_list *peVar6;
  exec_node *peVar7;
  void *mem_ctx;
  ir_constant *this_00;
  uint uVar8;
  ulong uVar9;
  ir_rvalue *piVar10;
  ir_rvalue *ptr;
  uint uVar11;
  exec_node *peVar12;
  ulong uVar13;
  exec_node *peVar14;
  ir_constant_data data;
  ir_constant_data local_b8;
  
  if (((this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
       in_assignee == false) && (ptr = *rvalue, ptr != (ir_rvalue *)0x0)) {
    type = ptr->type;
    bVar1 = type->vector_elements;
    uVar2 = *(uint *)&type->field_0x4;
    if ((bVar1 == 1 && (uVar2 & 0xfe) < 0xe) ||
       (((1 < bVar1 && (type->matrix_columns == '\x01')) && ((uVar2 & 0xfc) < 0xc)))) {
      iVar3 = (ptr->super_ir_instruction).ir_type;
      if (iVar3 == ir_type_dereference_variable) {
        piVar10 = (ir_rvalue *)0x0;
      }
      else if (((iVar3 != ir_type_swizzle) ||
               (piVar5 = (ir_rvalue *)ptr[1].super_ir_instruction._vptr_ir_instruction,
               piVar5 == (ir_rvalue *)0x0)) ||
              (piVar10 = ptr, ptr = piVar5,
              (piVar5->super_ir_instruction).ir_type != ir_type_dereference_variable))
      goto LAB_0017f364;
      local_b8._112_16_ = (undefined1  [16])0x0;
      local_b8._96_16_ = (undefined1  [16])0x0;
      local_b8._80_16_ = (undefined1  [16])0x0;
      local_b8._64_16_ = (undefined1  [16])0x0;
      local_b8._48_16_ = (undefined1  [16])0x0;
      local_b8._32_16_ = (undefined1  [16])0x0;
      local_b8._16_16_ = (undefined1  [16])0x0;
      local_b8.b[0] = false;
      local_b8.b[1] = false;
      local_b8.b[2] = false;
      local_b8.b[3] = false;
      local_b8.b[4] = false;
      local_b8.b[5] = false;
      local_b8.b[6] = false;
      local_b8.b[7] = false;
      local_b8.b[8] = false;
      local_b8.b[9] = false;
      local_b8.b[10] = false;
      local_b8.b[0xb] = false;
      local_b8.b[0xc] = false;
      local_b8.b[0xd] = false;
      local_b8.b[0xe] = false;
      local_b8.b[0xf] = false;
      uVar11 = (uint)type->matrix_columns * (uint)bVar1;
      if (uVar11 != 0) {
        peVar6 = this->acp;
        uVar13 = 0;
        do {
          uVar8 = (uint)uVar13;
          if (piVar10 != (ir_rvalue *)0x0) {
            switch(uVar13 & 0xffffffff) {
            case 0:
              uVar8 = (uint)*(ushort *)&piVar10[1].super_ir_instruction.super_exec_node.next;
              break;
            case 1:
              uVar8 = *(uint *)&piVar10[1].super_ir_instruction.super_exec_node.next >> 2;
              break;
            case 2:
              uVar8 = *(uint *)&piVar10[1].super_ir_instruction.super_exec_node.next >> 4;
              break;
            case 3:
              uVar8 = *(uint *)&piVar10[1].super_ir_instruction.super_exec_node.next >> 6;
              break;
            default:
              __assert_fail("!\"shouldn\'t be reached\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                            ,0xb7,
                            "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                           );
            }
            uVar8 = uVar8 & 3;
          }
          peVar14 = (peVar6->head_sentinel).next;
          peVar7 = peVar14->next;
          if (peVar7 == (exec_node *)0x0) goto LAB_0017f364;
          while ((peVar12 = peVar7,
                 peVar14[1].next != (exec_node *)ptr[1].super_ir_instruction._vptr_ir_instruction ||
                 ((*(uint *)&peVar14[2].next & 1 << ((byte)uVar8 & 0x1f)) == 0))) {
            peVar7 = peVar12->next;
            peVar14 = peVar12;
            if (peVar7 == (exec_node *)0x0) goto LAB_0017f364;
          }
          if (uVar8 == 0) {
            uVar9 = 0;
          }
          else {
            uVar8 = uVar8 - 1;
            if (2 < uVar8) {
              uVar8 = 3;
            }
            uVar4 = *(uint *)((long)&peVar14[2].next + 4);
            uVar9 = (ulong)((uVar4 >> 3 & -(uint)(2 < (int)uVar8) & 1) +
                            (uVar4 >> 1 & -(uint)(0 < (int)uVar8) & 1) +
                           (uVar4 >> 2 & -(uint)(1 < (int)uVar8) & 1) +
                           (uVar4 & -(uint)(-1 < (int)uVar8) & 1));
          }
          switch(uVar2 & 0xff) {
          case 0:
          case 1:
            *(undefined4 *)((long)&local_b8 + uVar13 * 4) =
                 *(undefined4 *)((long)&peVar14[1].prev[2].prev + uVar9 * 4);
            break;
          case 2:
            *(undefined4 *)((long)&local_b8 + uVar13 * 4) =
                 *(undefined4 *)((long)&peVar14[1].prev[2].prev + uVar9 * 4);
            break;
          case 3:
            *(undefined2 *)((long)&local_b8 + uVar13 * 2) =
                 *(undefined2 *)((long)&peVar14[1].prev[2].prev + uVar9 * 2);
            break;
          case 4:
            *(exec_node **)((long)&local_b8 + uVar13 * 8) = (&peVar14[1].prev[2].prev)[uVar9];
            break;
          default:
            __assert_fail("!\"not reached\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                          ,0xe9,
                          "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                         );
          case 9:
          case 10:
            *(exec_node **)((long)&local_b8 + uVar13 * 8) = (&peVar14[1].prev[2].prev)[uVar9];
            break;
          case 0xb:
            local_b8.b[uVar13] = *(bool *)((long)&peVar14[1].prev[2].prev + uVar9);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      mem_ctx = ralloc_parent(ptr);
      this_00 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
      ir_constant::ir_constant(this_00,type,&local_b8);
      *rvalue = (ir_rvalue *)this_00;
      this->progress = true;
    }
  }
LAB_0017f364:
  constant_folding(this,rvalue);
  return;
}

Assistant:

void
ir_constant_propagation_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   constant_propagation(rvalue);
   constant_folding(rvalue);
}